

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotExec.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  Map *map_00;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 auStack_8828 [187];
  undefined4 local_8250;
  GameMode local_8248;
  GameMode local_8244;
  undefined8 local_8240 [187];
  undefined4 local_7c68;
  int local_7c64;
  int i;
  undefined8 local_7770 [158];
  undefined8 local_7280 [187];
  undefined4 local_6ca8;
  int local_6ca0;
  _Bool local_6c9a [2];
  int level;
  _Bool progress [10];
  Path path;
  UnitNode *unitNode;
  UnitList guards;
  UnitList inmates;
  Dialog dialog [10];
  Map *map;
  MapList mapList;
  Windows windows;
  GameMode gameMode;
  char **argv_local;
  int argc_local;
  
  bVar5 = 0;
  local_6ca0 = 0;
  parseMap(argv[1],(MapList *)((long)&map + 4),(Dialog *)&inmates.count);
  uiInit((Windows *)&mapList.level[9].repMax);
  windows.footer._4_4_ = menuMain((Windows *)&mapList.level[9].repMax);
  do {
    if (windows.footer._4_4_ == EXIT) break;
    if (windows.footer._4_4_ != NEW) {
      local_6ca0 = levelSelect((Windows *)&mapList.level[9].repMax,(MapList *)((long)&map + 4),
                               local_6c9a);
    }
    map_00 = (Map *)((long)&map + (long)local_6ca0 * 0x4f0 + 4);
    local_8244 = windows.footer._4_4_;
    memcpy(local_7280,dialog[(long)local_6ca0 + -1].textLose + 0x1ec,0x5dc);
    puVar3 = local_7280;
    puVar4 = auStack_8828;
    for (lVar2 = 0xbb; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    local_8250 = local_6ca8;
    drawText(&mapList.level[9].repMax,local_8244);
    memcpy(local_7770,map_00,0x4f0);
    puVar3 = local_7770;
    puVar4 = auStack_8828;
    for (lVar2 = 0x9e; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    getGuards(&unitNode);
    memcpy(&stack0xffffffffffff83a0,map_00,0x4f0);
    puVar3 = (undefined8 *)&stack0xffffffffffff83a0;
    puVar4 = auStack_8828;
    for (lVar2 = 0x9e; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    getPath(progress + 2);
    inmates.tail._0_4_ = 0;
    guards.count = 0;
    guards._20_4_ = 0;
    inmates.head = (UnitNode *)0x0;
    drawLevel((Windows *)&mapList.level[9].repMax,map_00,(UnitList *)&unitNode);
    drawInmateSelection((Windows *)&mapList.level[9].repMax,map_00,(UnitList *)&guards.count,
                        (UnitList *)&unitNode);
    path._8_8_ = getHead((UnitList *)&guards.count);
    for (local_7c64 = 0; local_7c64 < (int)inmates.tail; local_7c64 = local_7c64 + 1) {
      *(float *)(*(long *)path._8_8_ + 4) = (float)*(int *)progress._2_8_;
      path._8_8_ = *(undefined8 *)(path._8_8_ + 8);
    }
    _Var1 = simulate((Windows *)&mapList.level[9].repMax,(UnitList *)&unitNode,
                     (UnitList *)&guards.count,(Path *)(progress + 2));
    local_6c9a[local_6ca0] = _Var1;
    if ((local_6c9a[local_6ca0] & 1U) == 0) {
      windows.footer._4_4_ = EXIT;
    }
    else {
      windows.footer._4_4_ = WIN;
    }
    local_8248 = windows.footer._4_4_;
    memcpy(local_8240,dialog[(long)local_6ca0 + -1].textLose + 0x1ec,0x5dc);
    puVar3 = local_8240;
    puVar4 = auStack_8828;
    for (lVar2 = 0xbb; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    local_8250 = local_7c68;
    drawText(&mapList.level[9].repMax,local_8248);
  } while (local_6ca0 != 0x65);
  uiFree((Windows *)&mapList.level[9].repMax);
  quit("Thanks for playing.\n");
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    enum GameMode gameMode;
    struct Windows windows;
    struct MapList mapList;
    struct Map *map;
    struct Dialog dialog[MAX_LEVELS];
    struct UnitList inmates, guards;
    struct UnitNode *unitNode;
    struct Path path;
    bool progress[MAX_LEVELS];
    int level=0;

    /* Parse map files */
    parseMap(argv[1], &mapList, dialog);

    /* Create nCurses WINDOWs */
    uiInit(&windows);

    /* Present user with main menu */
    gameMode = menuMain(&windows);

    do{
        if(gameMode==EXIT){
            break;
        } else if (gameMode!=NEW){
            level = levelSelect(&windows, &mapList, progress);
        }

        /* Select current map */
        map = &(mapList).level[level];

        /* Display intro text */
        drawText(&windows, dialog[level], gameMode);

        /* Initialize game elements */
        getGuards(&guards, *map);
        getPath(&path, *map);
        inmates.count = 0;
        inmates.head = NULL;
        inmates.tail = NULL;

        /* Draw level */
        drawLevel(&windows, map, &guards);

        /* Prompt user for unit selection */
        drawInmateSelection(&windows, map, &inmates, &guards);

        unitNode = getHead(&inmates);
        for (int i = 0; i < inmates.count; i++) {
            ((struct Inmate *) unitNode->unit)->position = path.first->location;
            unitNode = unitNode->next;
        }

        /* Simulate unit interactions */
        progress[level] = simulate(&windows, &guards, &inmates, &path);
        if(progress[level]) gameMode=WIN;
        else gameMode=LOSE;

        /* Display outro text */
        drawText(&windows, dialog[level], gameMode);

    } while (level!=EXIT);

    uiFree(&windows);
    quit("Thanks for playing.\n");

    return 0;
}